

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O0

void __thiscall
CVmObjClass::set_prop
          (CVmObjClass *this,CVmUndo *undo,vm_obj_id_t self,vm_prop_id_t prop,vm_val_t *val)

{
  CVmMetaclass *pCVar1;
  int iVar2;
  vm_obj_id_t vVar3;
  vm_meta_entry_t *pvVar4;
  vm_intcls_ext *pvVar5;
  CVmObject *pCVar6;
  ushort in_CX;
  uint in_EDX;
  undefined8 in_RSI;
  CVmObjClass *in_RDI;
  undefined8 in_R8;
  vm_obj_id_t mod_obj;
  vm_meta_entry_t *entry;
  CVmObjClass *in_stack_ffffffffffffffb8;
  undefined8 uVar7;
  
  pvVar4 = get_meta_entry(in_stack_ffffffffffffffb8);
  if (pvVar4 != (vm_meta_entry_t *)0x0) {
    pCVar1 = pvVar4->meta_;
    uVar7 = in_RSI;
    pvVar5 = get_ext(in_RDI);
    iVar2 = (*pCVar1->_vptr_CVmMetaclass[7])
                      (pCVar1,uVar7,(ulong)in_EDX,&pvVar5->class_state,(ulong)in_CX,in_R8);
    if (iVar2 != 0) {
      return;
    }
  }
  vVar3 = get_mod_obj((CVmObjClass *)0x36464f);
  if (vVar3 != 0) {
    pCVar6 = vm_objp(0);
    (*pCVar6->_vptr_CVmObject[0xc])(pCVar6,in_RSI,(ulong)vVar3,(ulong)in_CX,in_R8);
    return;
  }
  err_throw(0);
}

Assistant:

void CVmObjClass::set_prop(VMG_ CVmUndo *undo,
                           vm_obj_id_t self, vm_prop_id_t prop,
                           const vm_val_t *val)
{
    /* try treating the request as a static property of the metaclass */
    vm_meta_entry_t *entry = get_meta_entry(vmg0_);
    if (entry != 0
        && entry->meta_->set_stat_prop(
            vmg_ undo, self, &get_ext()->class_state, prop, val))
        return;

    /* the class doesn't handle it, so check for a modifier object */
    vm_obj_id_t mod_obj = get_mod_obj();
    if (mod_obj != VM_INVALID_OBJ)
    {
        /* we have a modifier - set the property in the modifier */
        vm_objp(vmg_ mod_obj)->set_prop(vmg_ undo, mod_obj, prop, val);
    }
    else
    {
        /* if we don't have a modifier, we can't set the property */
        err_throw(VMERR_INVALID_SETPROP);
    }
}